

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateWorkgroupSizeAtDefinition
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst)

{
  ValidationState_t *pVVar1;
  Instruction *decoration_00;
  bool bVar2;
  Op OVar3;
  int32_t iVar4;
  uint32_t uVar5;
  spv_result_t sVar6;
  spv_const_context psVar7;
  DiagnosticStream *pDVar8;
  Instruction *pIVar9;
  Instruction *inst_00;
  DiagnosticStream local_470;
  undefined1 local_293;
  byte local_292;
  byte local_291;
  bool static_z;
  bool static_y;
  uint64_t uStack_290;
  bool static_x;
  uint64_t z_size;
  uint64_t y_size;
  uint64_t x_size;
  string local_258;
  DiagnosticStream local_238;
  anon_class_16_2_3fe15001 local_60;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  undefined4 local_2c;
  Instruction *pIStack_28;
  spv_result_t error;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  pIStack_28 = inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar7 = ValidationState_t::context(this->_);
  bVar2 = spvIsVulkanEnv(psVar7->target_env);
  decoration_00 = inst_local;
  pIVar9 = pIStack_28;
  if (bVar2) {
    local_60.inst = pIStack_28;
    local_60.this = this;
    std::function<spv_result_t(std::__cxx11::string_const&)>::
    function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidateWorkgroupSizeAtDefinition(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&)::__0,void>
              ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_50,&local_60);
    sVar6 = ValidateI32Vec(this,(Decoration *)decoration_00,pIVar9,3,&local_50);
    std::
    function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_50);
    if (sVar6 != SPV_SUCCESS) {
      return sVar6;
    }
    local_2c = 0;
  }
  OVar3 = val::Instruction::opcode(pIStack_28);
  iVar4 = spvOpcodeIsConstant(OVar3);
  if (iVar4 == 0) {
    psVar7 = ValidationState_t::context(this->_);
    bVar2 = spvIsVulkanEnv(psVar7->target_env);
    if (bVar2) {
      ValidationState_t::diag(&local_238,this->_,SPV_ERROR_INVALID_DATA,pIStack_28);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_258,this->_,0x114a,(char *)0x0);
      pDVar8 = DiagnosticStream::operator<<(&local_238,&local_258);
      pDVar8 = DiagnosticStream::operator<<
                         (pDVar8,(char (*) [62])
                                 "Vulkan spec requires BuiltIn WorkgroupSize to be a constant. ");
      (anonymous_namespace)::GetIdDesc_abi_cxx11_
                ((string *)&x_size,(_anonymous_namespace_ *)pIStack_28,inst_00);
      pDVar8 = DiagnosticStream::operator<<
                         (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&x_size);
      pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [20])" is not a constant.");
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      std::__cxx11::string::~string((string *)&x_size);
      std::__cxx11::string::~string((string *)&local_258);
      DiagnosticStream::~DiagnosticStream(&local_238);
      return this_local._4_4_;
    }
  }
  else {
    OVar3 = val::Instruction::opcode(pIStack_28);
    if (OVar3 == OpConstantComposite) {
      pVVar1 = this->_;
      uVar5 = val::Instruction::word(pIStack_28,3);
      pIVar9 = ValidationState_t::FindDef(pVVar1,uVar5);
      OVar3 = val::Instruction::opcode(pIVar9);
      if (OVar3 == OpConstant) {
        pVVar1 = this->_;
        uVar5 = val::Instruction::word(pIStack_28,4);
        pIVar9 = ValidationState_t::FindDef(pVVar1,uVar5);
        OVar3 = val::Instruction::opcode(pIVar9);
        if (OVar3 == OpConstant) {
          pVVar1 = this->_;
          uVar5 = val::Instruction::word(pIStack_28,5);
          pIVar9 = ValidationState_t::FindDef(pVVar1,uVar5);
          OVar3 = val::Instruction::opcode(pIVar9);
          if (OVar3 == OpConstant) {
            pVVar1 = this->_;
            uVar5 = val::Instruction::word(pIStack_28,3);
            local_291 = ValidationState_t::EvalConstantValUint64(pVVar1,uVar5,&y_size);
            pVVar1 = this->_;
            uVar5 = val::Instruction::word(pIStack_28,4);
            local_292 = ValidationState_t::EvalConstantValUint64(pVVar1,uVar5,&z_size);
            pVVar1 = this->_;
            uVar5 = val::Instruction::word(pIStack_28,5);
            local_293 = ValidationState_t::EvalConstantValUint64
                                  (pVVar1,uVar5,&stack0xfffffffffffffd70);
            if (((((local_291 & 1) != 0) && ((local_292 & 1) != 0)) && ((bool)local_293)) &&
               (y_size * z_size * uStack_290 == 0)) {
              ValidationState_t::diag(&local_470,this->_,SPV_ERROR_INVALID_DATA,pIStack_28);
              pDVar8 = DiagnosticStream::operator<<
                                 (&local_470,
                                  (char (*) [71])
                                  "WorkgroupSize decorations must not have a static product of zero (X = "
                                 );
              pDVar8 = DiagnosticStream::operator<<(pDVar8,&y_size);
              pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [7])", Y = ");
              pDVar8 = DiagnosticStream::operator<<(pDVar8,&z_size);
              pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [7])", Z = ");
              pDVar8 = DiagnosticStream::operator<<(pDVar8,&stack0xfffffffffffffd70);
              pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [3])0xf65ced);
              this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
              DiagnosticStream::~DiagnosticStream(&local_470);
              return this_local._4_4_;
            }
          }
        }
      }
    }
  }
  sVar6 = ValidateWorkgroupSizeAtReference
                    (this,(Decoration *)inst_local,pIStack_28,pIStack_28,pIStack_28);
  return sVar6;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateWorkgroupSizeAtDefinition(
    const Decoration& decoration, const Instruction& inst) {
  // Vulkan requires 32-bit int, but Universal has no restrictions
  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (spv_result_t error = ValidateI32Vec(
            decoration, inst, 3,
            [this, &inst](const std::string& message) -> spv_result_t {
              return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                     << _.VkErrorID(4427) << "According to the "
                     << spvLogStringForEnv(_.context()->target_env)
                     << " spec BuiltIn WorkgroupSize variable needs to be a "
                        "3-component 32-bit int vector. "
                     << message;
            })) {
      return error;
    }
  }

  if (!spvOpcodeIsConstant(inst.opcode())) {
    if (spvIsVulkanEnv(_.context()->target_env)) {
      return _.diag(SPV_ERROR_INVALID_DATA, &inst)
             << _.VkErrorID(4426)
             << "Vulkan spec requires BuiltIn WorkgroupSize to be a "
                "constant. "
             << GetIdDesc(inst) << " is not a constant.";
    }
  } else if (inst.opcode() == spv::Op::OpConstantComposite) {
    // can only validate product if static and not spec constant
    if (_.FindDef(inst.word(3))->opcode() == spv::Op::OpConstant &&
        _.FindDef(inst.word(4))->opcode() == spv::Op::OpConstant &&
        _.FindDef(inst.word(5))->opcode() == spv::Op::OpConstant) {
      uint64_t x_size, y_size, z_size;
      // ValidateI32Vec above confirms there will be 3 words to read
      bool static_x = _.EvalConstantValUint64(inst.word(3), &x_size);
      bool static_y = _.EvalConstantValUint64(inst.word(4), &y_size);
      bool static_z = _.EvalConstantValUint64(inst.word(5), &z_size);
      if (static_x && static_y && static_z &&
          ((x_size * y_size * z_size) == 0)) {
        return _.diag(SPV_ERROR_INVALID_DATA, &inst)
               << "WorkgroupSize decorations must not have a static "
                  "product of zero (X = "
               << x_size << ", Y = " << y_size << ", Z = " << z_size << ").";
      }
    }
  }

  // Seed at reference checks with this built-in.
  return ValidateWorkgroupSizeAtReference(decoration, inst, inst, inst);
}